

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O1

void __thiscall
VBitmap::VBitmap(VBitmap *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,
                Format format)

{
  rc_ptr<Impl> rVar1;
  undefined7 in_register_00000089;
  VBitmap local_38;
  
  (this->mImpl).mModel = (model *)0x0;
  if ((int)CONCAT71(in_register_00000089,format) != 0 &&
      ((bytesPerLine != 0 && height != 0) && (width != 0 && data != (uint8_t *)0x0))) {
    rVar1.mModel = (model *)operator_new(0x28);
    (rVar1.mModel)->mRef = 1;
    ((rVar1.mModel)->mValue).mOwnData._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    ((rVar1.mModel)->mValue).mRoData = (uint8_t *)0x0;
    *(undefined8 *)((long)&((rVar1.mModel)->mValue).mRoData + 6) = 0;
    *(undefined8 *)((long)&((rVar1.mModel)->mValue).mHeight + 2) = 0;
    Impl::reset(&(rVar1.mModel)->mValue,data,width,height,bytesPerLine,format);
    local_38.mImpl.mModel = (rc_ptr<Impl>)(rc_ptr<Impl>)rVar1.mModel;
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&this->mImpl);
    (this->mImpl).mModel = (model *)local_38;
    local_38.mImpl.mModel = (rc_ptr<Impl>)(model *)0x0;
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&local_38.mImpl);
  }
  return;
}

Assistant:

VBitmap::VBitmap(uint8_t *data, size_t width, size_t height,
                 size_t bytesPerLine, VBitmap::Format format)
{
    if (!data || width <= 0 || height <= 0 || bytesPerLine <= 0 ||
        format == Format::Invalid)
        return;

    mImpl = rc_ptr<Impl>(data, width, height, bytesPerLine, format);
}